

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int check_const_addr_p(c2m_ctx_t c2m_ctx,node_t_conflict r,node_t_conflict *base,mir_llong *offset,
                      int *deref)

{
  node_code_t nVar1;
  byte *pbVar2;
  check_ctx *pcVar3;
  void *pvVar4;
  type *ptVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  mir_size_t mVar10;
  node_t_conflict pnVar11;
  ulong uVar12;
  long lVar13;
  type *ptVar14;
  node_t_conflict pnVar15;
  node_t r_00;
  
  iVar8 = 0;
  while( true ) {
    pbVar2 = (byte *)r->attr;
    pcVar3 = c2m_ctx->check_ctx;
    if (((*pbVar2 & 1) != 0) && (iVar7 = integer_type_p(*(type **)(pbVar2 + 0x18)), iVar7 != 0))
    break;
    nVar1 = r->code;
    if (nVar1 != N_CAST) {
      switch(nVar1) {
      case N_ADD:
      case N_SUB:
        pnVar11 = DLIST_node_t_el(&(r->u).ops,1);
        if (pnVar11 == (node_t_conflict)0x0) {
          return 0;
        }
        r_00 = (r->u).ops.head;
        pnVar15 = pnVar11;
        if ((nVar1 == N_ADD) && ((*r_00->attr & 1) != 0)) {
          pnVar15 = r_00;
          r_00 = pnVar11;
        }
        iVar8 = check_const_addr_p(c2m_ctx,r_00,base,offset,deref);
        if (iVar8 == 0) {
          return 0;
        }
        if ((*deref != 0) && (*(long *)(*(long *)((long)r_00->attr + 0x18) + 8) == 0)) {
          return 0;
        }
        pbVar2 = (byte *)pnVar15->attr;
        if ((*pbVar2 & 1) == 0) {
          if ((*pbVar2 & 2) == 0) {
            return 0;
          }
          if (*(int **)(pbVar2 + 0x10) == (int *)0x0) {
            return 0;
          }
          if (**(int **)(pbVar2 + 0x10) != 0x53) {
            return 0;
          }
        }
        lVar13 = *(long *)((long)r->attr + 0x18);
        uVar9 = *(uint *)(lVar13 + 0x18);
        uVar12 = (ulong)uVar9;
        if (uVar12 != 1) {
          if (uVar9 != 3) {
            __assert_fail("type->mode == TM_BASIC || type->mode == TM_PTR",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x1d85,
                          "int check_const_addr_p(c2m_ctx_t, node_t, node_t *, mir_llong *, int *)")
            ;
          }
          ptVar5 = *(type **)(lVar13 + 0x30);
          if (ptVar5->mode == TM_FUNC) {
            uVar12 = 1;
          }
          else {
            ptVar14 = ptVar5->arr_type;
            if (ptVar5->arr_type == (type *)0x0) {
              ptVar14 = ptVar5;
            }
            uVar12 = type_size(c2m_ctx,ptVar14);
          }
        }
        lVar13 = -(uVar12 * *(long *)(pbVar2 + 0x30));
        if (r->code == N_ADD) {
          lVar13 = uVar12 * *(long *)(pbVar2 + 0x30);
        }
        *offset = *offset + lVar13;
        break;
      case N_ADD_ASSIGN:
      case N_SUB_ASSIGN:
      case N_MUL:
      case N_MUL_ASSIGN:
      case N_DIV:
      case N_DIV_ASSIGN:
      case N_MOD:
      case N_MOD_ASSIGN:
        goto switchD_0015987a_caseD_29;
      case N_IND:
        pnVar11 = (r->u).ops.head;
        if (*(int *)(*(long *)((long)pnVar11->attr + 0x18) + 0x18) != 3) {
          return 0;
        }
        iVar8 = check_const_addr_p(c2m_ctx,pnVar11,base,offset,deref);
        if (iVar8 == 0) {
          return 0;
        }
        pnVar11 = DLIST_node_t_el(&(r->u).ops,1);
        pbVar2 = (byte *)pnVar11->attr;
        if ((*pbVar2 & 1) == 0) {
          return 0;
        }
        ptVar5 = *(type **)((long)r->attr + 0x18);
        ptVar14 = ptVar5->arr_type;
        if (ptVar14 == (type *)0x0) {
          ptVar14 = ptVar5;
        }
        mVar10 = type_size(c2m_ctx,ptVar14);
        *deref = 1;
        *offset = *offset + mVar10 * *(long *)(pbVar2 + 0x30);
        return 1;
      case N_FIELD:
      case N_DEREF_FIELD:
        iVar8 = check_const_addr_p(c2m_ctx,(r->u).ops.head,base,offset,deref);
        if (iVar8 == 0) {
          return 0;
        }
        if (*deref != (uint)(r->code == N_FIELD)) {
          return 0;
        }
        *deref = 1;
        lVar13 = *(long *)((long)r->attr + 8);
        if (lVar13 != 0) {
          *offset = *offset + *(long *)(*(long *)(lVar13 + 8) + 0x10);
        }
        break;
      case N_ADDR:
      case N_DEREF:
        pnVar11 = (r->u).ops.head;
        pvVar4 = pnVar11->attr;
        iVar8 = check_const_addr_p(c2m_ctx,pnVar11,base,offset,deref);
        if (iVar8 == 0) {
          return 0;
        }
        if (r->code == N_ADDR) {
          lVar13 = *(long *)((long)pvVar4 + 0x18);
          iVar8 = *(int *)(lVar13 + 0x18);
          if ((iVar8 == 6) || ((iVar8 == 3 && (*(long *)(lVar13 + 8) != 0)))) {
            if (0 < *deref) {
              *deref = *deref + -1;
            }
            break;
          }
        }
        if (pnVar11->code == N_ID) {
          piVar6 = *(int **)((long)pvVar4 + 0x10);
          iVar8 = *piVar6;
          if ((iVar8 == 0x7d) ||
             ((iVar8 == 0x55 && (*(int *)(*(long *)(*(long *)(piVar6 + 2) + 0x40) + 0x18) == 7))))
          break;
        }
        if (r->code == N_DEREF) {
          iVar8 = *deref + 1;
        }
        else {
          iVar8 = *deref + -1;
        }
        *deref = iVar8;
        break;
      default:
        if (nVar1 - N_STR < 3) {
          *base = r;
          *offset = 0;
          *deref = 0;
          return (uint)(pcVar3->curr_scope == c2m_ctx->top_scope);
        }
        if (nVar1 != N_ID) {
          if (nVar1 != N_LABEL_ADDR) {
            return 0;
          }
          *base = r;
          *offset = 0;
          goto LAB_00159b0e;
        }
        pnVar11 = *(node_t_conflict *)(pbVar2 + 0x10);
        if (pnVar11 == (node_t_conflict)0x0) {
          return 0;
        }
        if ((pnVar11->code == N_FUNC_DEF) ||
           ((pnVar11->code == N_SPEC_DECL &&
            (*(int *)(*(long *)((long)pnVar11->attr + 0x40) + 0x18) == 7)))) {
          *base = pnVar11;
          uVar9 = 0;
        }
        else {
          if (*(long *)(pbVar2 + 8) == 0) {
            return 0;
          }
          lVar13 = *(long *)(*(long *)(pbVar2 + 8) + 8);
          if ((*(node_t_conflict *)(lVar13 + 0x18) != c2m_ctx->top_scope) &&
             (*(int *)(lVar13 + 0x38) != 0)) {
            return 0;
          }
          *base = pnVar11;
          uVar9 = (uint)(*(long *)(*(long *)(pbVar2 + 0x18) + 8) == 0);
        }
        *deref = uVar9;
        *offset = 0;
      }
      goto LAB_00159c26;
    }
    mVar10 = type_size(c2m_ctx,*(type **)((long)((r->u).ops.head)->attr + 0x18));
    if (mVar10 != 8) {
      return 0;
    }
    r = DLIST_node_t_el(&(r->u).ops,1);
  }
  *base = (node_t_conflict)0x0;
  *offset = *(mir_llong *)(pbVar2 + 0x30);
LAB_00159b0e:
  *deref = 0;
LAB_00159c26:
  iVar8 = 1;
switchD_0015987a_caseD_29:
  return iVar8;
}

Assistant:

static int check_const_addr_p (c2m_ctx_t c2m_ctx, node_t r, node_t *base, mir_llong *offset,
                               int *deref) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  struct expr *e = r->attr;
  struct type *type;
  node_t op1, op2, temp;
  decl_t decl;
  struct decl_spec *decl_spec;
  mir_size_t size;

  if (e->const_p && integer_type_p (e->type)) {
    *base = NULL;
    *offset = (mir_size_t) e->c.u_val;
    *deref = 0;
    return TRUE;
  }
  switch (r->code) {
  case N_STR:
  case N_STR16:
  case N_STR32:
    *base = r;
    *offset = 0;
    *deref = 0;
    return curr_scope == top_scope;
  case N_LABEL_ADDR:
    *base = r;
    *offset = 0;
    *deref = 0;
    return TRUE;
  case N_ID:
    if (e->def_node == NULL)
      return FALSE;
    else if (e->def_node->code == N_FUNC_DEF
             || (e->def_node->code == N_SPEC_DECL
                 && ((decl_t) e->def_node->attr)->decl_spec.type->mode == TM_FUNC)) {
      *base = e->def_node;
      *deref = 0;
    } else if (e->u.lvalue_node == NULL
               || ((decl = e->u.lvalue_node->attr)->scope != top_scope
                   && decl->decl_spec.linkage != N_IGNORE)) {
      return FALSE;
    } else {
      *base = e->def_node;
      *deref = e->type->arr_type == NULL;
    }
    *offset = 0;
    return TRUE;
  case N_DEREF:
  case N_ADDR: {
    node_t op = NL_HEAD (r->u.ops);
    struct expr *op_e = op->attr;

    if (!check_const_addr_p (c2m_ctx, op, base, offset, deref)) return FALSE;
    if (r->code == N_ADDR
        && (op_e->type->mode == TM_ARR
            || (op_e->type->mode == TM_PTR && op_e->type->arr_type != NULL))) {
      if (*deref > 0) (*deref)--;
    } else if (op->code != N_ID
               || (op_e->def_node->code != N_FUNC_DEF
                   && (op_e->def_node->code != N_SPEC_DECL
                       || ((decl_t) op_e->def_node->attr)->decl_spec.type->mode != TM_FUNC))) {
      r->code == N_DEREF ? (*deref)++ : (*deref)--;
    }
    return TRUE;
  }
  case N_FIELD:
  case N_DEREF_FIELD:
    if (!check_const_addr_p (c2m_ctx, NL_HEAD (r->u.ops), base, offset, deref)) return FALSE;
    if (*deref != (r->code == N_FIELD ? 1 : 0)) return FALSE;
    *deref = 1;
    e = r->attr;
    if (e->u.lvalue_node != NULL) {
      decl = e->u.lvalue_node->attr;
      *offset += decl->offset;
    }
    return TRUE;
  case N_IND:
    if (((struct expr *) NL_HEAD (r->u.ops)->attr)->type->mode != TM_PTR) return FALSE;
    if (!check_const_addr_p (c2m_ctx, NL_HEAD (r->u.ops), base, offset, deref)) return FALSE;
    if (!(e = NL_EL (r->u.ops, 1)->attr)->const_p) return FALSE;
    type = ((struct expr *) r->attr)->type;
    size = type_size (c2m_ctx, type->arr_type != NULL ? type->arr_type : type);
    *deref = 1;
    *offset += e->c.i_val * size;
    return TRUE;
  case N_ADD:
  case N_SUB:
    if ((op2 = NL_EL (r->u.ops, 1)) == NULL) return FALSE;
    op1 = NL_HEAD (r->u.ops);
    if (r->code == N_ADD && (e = op1->attr)->const_p) SWAP (op1, op2, temp);
    if (!check_const_addr_p (c2m_ctx, op1, base, offset, deref)) return FALSE;
    if (*deref != 0 && ((struct expr *) op1->attr)->type->arr_type == NULL) return FALSE;
    if (!(e = op2->attr)->const_p
        && (!e->const_addr_p || e->def_node == NULL || e->def_node->code != N_LABEL_ADDR))
      return FALSE;
    type = ((struct expr *) r->attr)->type;
    assert (type->mode == TM_BASIC || type->mode == TM_PTR);
    size = (type->mode == TM_BASIC || type->u.ptr_type->mode == TM_FUNC
              ? 1
              : type_size (c2m_ctx, type->u.ptr_type->arr_type != NULL ? type->u.ptr_type->arr_type
                                                                       : type->u.ptr_type));
    if (r->code == N_ADD)
      *offset += e->c.i_val * size;
    else
      *offset -= e->c.i_val * size;
    return TRUE;
  case N_CAST:
    decl_spec = NL_HEAD (r->u.ops)->attr;
    if (type_size (c2m_ctx, decl_spec->type) != sizeof (mir_size_t)) return FALSE;
    return check_const_addr_p (c2m_ctx, NL_EL (r->u.ops, 1), base, offset, deref);
  default: return FALSE;
  }
}